

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

int av1_alloc_above_context_buffers
              (CommonContexts *above_contexts,int num_tile_rows,int num_mi_cols,int num_planes)

{
  void *pvVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int plane_idx_1;
  int tile_row;
  int plane_idx;
  int aligned_mi_cols;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  int iVar4;
  int local_4;
  
  *(int *)((long)in_RDI + 0x2c) = in_ESI;
  *(uint *)(in_RDI + 6) = in_EDX + 0x1fU & 0xffffffe0;
  *(int *)(in_RDI + 5) = in_ECX;
  for (iVar4 = 0; iVar4 < in_ECX; iVar4 = iVar4 + 1) {
    pvVar1 = aom_calloc(CONCAT44(iVar4,in_stack_ffffffffffffffd8),
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    in_RDI[(long)iVar4 + 1] = (long)pvVar1;
    if (in_RDI[(long)iVar4 + 1] == 0) {
      return 1;
    }
  }
  pvVar1 = aom_calloc(CONCAT44(iVar4,in_stack_ffffffffffffffd8),
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  *in_RDI = (long)pvVar1;
  if (*in_RDI == 0) {
    local_4 = 1;
  }
  else {
    pvVar1 = aom_calloc(CONCAT44(iVar4,in_stack_ffffffffffffffd8),
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    in_RDI[4] = (long)pvVar1;
    if (in_RDI[4] == 0) {
      local_4 = 1;
    }
    else {
      for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
        for (iVar2 = 0; iVar2 < in_ECX; iVar2 = iVar2 + 1) {
          pvVar1 = aom_calloc(CONCAT44(iVar4,iVar3),CONCAT44(iVar2,in_stack_ffffffffffffffd0));
          *(void **)(in_RDI[(long)iVar2 + 1] + (long)iVar3 * 8) = pvVar1;
          if (*(long *)(in_RDI[(long)iVar2 + 1] + (long)iVar3 * 8) == 0) {
            return 1;
          }
        }
        pvVar1 = aom_calloc(CONCAT44(iVar4,iVar3),CONCAT44(iVar2,in_stack_ffffffffffffffd0));
        *(void **)(*in_RDI + (long)iVar3 * 8) = pvVar1;
        if (*(long *)(*in_RDI + (long)iVar3 * 8) == 0) {
          return 1;
        }
        pvVar1 = aom_calloc(CONCAT44(iVar4,iVar3),CONCAT44(iVar2,in_stack_ffffffffffffffd0));
        *(void **)(in_RDI[4] + (long)iVar3 * 8) = pvVar1;
        if (*(long *)(in_RDI[4] + (long)iVar3 * 8) == 0) {
          return 1;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int av1_alloc_above_context_buffers(CommonContexts *above_contexts,
                                    int num_tile_rows, int num_mi_cols,
                                    int num_planes) {
  const int aligned_mi_cols =
      ALIGN_POWER_OF_TWO(num_mi_cols, MAX_MIB_SIZE_LOG2);

  // Allocate above context buffers
  above_contexts->num_tile_rows = num_tile_rows;
  above_contexts->num_mi_cols = aligned_mi_cols;
  above_contexts->num_planes = num_planes;
  for (int plane_idx = 0; plane_idx < num_planes; plane_idx++) {
    above_contexts->entropy[plane_idx] = (ENTROPY_CONTEXT **)aom_calloc(
        num_tile_rows, sizeof(above_contexts->entropy[0]));
    if (!above_contexts->entropy[plane_idx]) return 1;
  }

  above_contexts->partition = (PARTITION_CONTEXT **)aom_calloc(
      num_tile_rows, sizeof(above_contexts->partition));
  if (!above_contexts->partition) return 1;

  above_contexts->txfm =
      (TXFM_CONTEXT **)aom_calloc(num_tile_rows, sizeof(above_contexts->txfm));
  if (!above_contexts->txfm) return 1;

  for (int tile_row = 0; tile_row < num_tile_rows; tile_row++) {
    for (int plane_idx = 0; plane_idx < num_planes; plane_idx++) {
      above_contexts->entropy[plane_idx][tile_row] =
          (ENTROPY_CONTEXT *)aom_calloc(
              aligned_mi_cols, sizeof(*above_contexts->entropy[0][tile_row]));
      if (!above_contexts->entropy[plane_idx][tile_row]) return 1;
    }

    above_contexts->partition[tile_row] = (PARTITION_CONTEXT *)aom_calloc(
        aligned_mi_cols, sizeof(*above_contexts->partition[tile_row]));
    if (!above_contexts->partition[tile_row]) return 1;

    above_contexts->txfm[tile_row] = (TXFM_CONTEXT *)aom_calloc(
        aligned_mi_cols, sizeof(*above_contexts->txfm[tile_row]));
    if (!above_contexts->txfm[tile_row]) return 1;
  }

  return 0;
}